

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O1

mg_relationship * mg_relationship_copy_ca(mg_relationship *rel,mg_allocator *allocator)

{
  int64_t iVar1;
  mg_relationship *buf;
  mg_string *pmVar2;
  mg_map *pmVar3;
  
  if ((rel != (mg_relationship *)0x0) &&
     (buf = (mg_relationship *)mg_allocator_malloc(&mg_system_allocator,0x28),
     buf != (mg_relationship *)0x0)) {
    iVar1 = rel->start_id;
    buf->id = rel->id;
    buf->start_id = iVar1;
    buf->end_id = rel->end_id;
    pmVar2 = mg_string_copy_ca(rel->type,allocator);
    buf->type = pmVar2;
    if (pmVar2 != (mg_string *)0x0) {
      pmVar3 = mg_map_copy_ca(rel->properties,allocator);
      buf->properties = pmVar3;
      if (pmVar3 != (mg_map *)0x0) {
        return buf;
      }
      if (buf->type != (mg_string *)0x0) {
        mg_allocator_free(&mg_system_allocator,buf->type);
      }
    }
    mg_allocator_free(&mg_system_allocator,buf);
  }
  return (mg_relationship *)0x0;
}

Assistant:

mg_relationship *mg_relationship_copy_ca(const mg_relationship *rel,
                                         mg_allocator *allocator) {
  if (!rel) {
    return NULL;
  }
  mg_relationship *nrel =
      mg_allocator_malloc(&mg_system_allocator, sizeof(mg_relationship));
  if (!nrel) {
    return NULL;
  }
  nrel->id = rel->id;
  nrel->start_id = rel->start_id;
  nrel->end_id = rel->end_id;
  nrel->type = mg_string_copy_ca(rel->type, allocator);
  if (!nrel->type) {
    goto cleanup;
  }
  nrel->properties = mg_map_copy_ca(rel->properties, allocator);
  if (!nrel->properties) {
    goto cleanup_type;
  }
  return nrel;

cleanup_type:
  mg_string_destroy(nrel->type);

cleanup:
  mg_allocator_free(&mg_system_allocator, nrel);
  return NULL;
}